

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O0

OPJ_BOOL opj_set_MCT(opj_cparameters_t *parameters,OPJ_FLOAT32 *pEncodingMatrix,
                    OPJ_INT32 *p_dc_shift,OPJ_UINT32 pNbComp)

{
  uint uVar1;
  void *pvVar2;
  bool bVar3;
  OPJ_UINT32 l_mct_total_size;
  OPJ_UINT32 l_dc_shift_size;
  OPJ_UINT32 l_matrix_size;
  OPJ_UINT32 pNbComp_local;
  OPJ_INT32 *p_dc_shift_local;
  OPJ_FLOAT32 *pEncodingMatrix_local;
  opj_cparameters_t *parameters_local;
  
  uVar1 = pNbComp * pNbComp * 4;
  if ((parameters->rsiz & 0x8000) == 0) {
    parameters->rsiz = 0x8100;
  }
  else {
    parameters->rsiz = parameters->rsiz | 0x100;
  }
  parameters->irreversible = 1;
  parameters->tcp_mct = '\x02';
  pvVar2 = opj_malloc((ulong)(uVar1 + pNbComp * 4));
  parameters->mct_data = pvVar2;
  bVar3 = parameters->mct_data != (void *)0x0;
  if (bVar3) {
    memcpy(parameters->mct_data,pEncodingMatrix,(ulong)uVar1);
    memcpy((void *)((long)parameters->mct_data + (ulong)uVar1),p_dc_shift,(ulong)(pNbComp * 4));
  }
  parameters_local._4_4_ = (uint)bVar3;
  return parameters_local._4_4_;
}

Assistant:

OPJ_BOOL OPJ_CALLCONV opj_set_MCT(opj_cparameters_t *parameters,
                                  OPJ_FLOAT32 * pEncodingMatrix,
                                  OPJ_INT32 * p_dc_shift, OPJ_UINT32 pNbComp)
{
    OPJ_UINT32 l_matrix_size = pNbComp * pNbComp * (OPJ_UINT32)sizeof(OPJ_FLOAT32);
    OPJ_UINT32 l_dc_shift_size = pNbComp * (OPJ_UINT32)sizeof(OPJ_INT32);
    OPJ_UINT32 l_mct_total_size = l_matrix_size + l_dc_shift_size;

    /* add MCT capability */
    if (OPJ_IS_PART2(parameters->rsiz)) {
        parameters->rsiz |= OPJ_EXTENSION_MCT;
    } else {
        parameters->rsiz = ((OPJ_PROFILE_PART2) | (OPJ_EXTENSION_MCT));
    }
    parameters->irreversible = 1;

    /* use array based MCT */
    parameters->tcp_mct = 2;
    parameters->mct_data = opj_malloc(l_mct_total_size);
    if (! parameters->mct_data) {
        return OPJ_FALSE;
    }

    memcpy(parameters->mct_data, pEncodingMatrix, l_matrix_size);
    memcpy(((OPJ_BYTE *) parameters->mct_data) +  l_matrix_size, p_dc_shift,
           l_dc_shift_size);

    return OPJ_TRUE;
}